

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbarom.c
# Opt level: O2

void load_gbarom(char *filename)

{
  FILE *__stream;
  size_t __size;
  uint8_t *__ptr;
  
  __stream = fopen(filename,"rb");
  fseek(__stream,0,2);
  __size = ftell(__stream);
  fseek(__stream,0,0);
  __ptr = (uint8_t *)malloc(__size);
  fread(__ptr,__size,1,__stream);
  mem->rom = __ptr;
  mem->rom_size = __size;
  return;
}

Assistant:

void load_gbarom(const char* filename) {
    FILE *fp = fopen(filename, "rb");

    fseek(fp, 0, SEEK_END);
    size_t size = ftell(fp);
    fseek(fp, 0, SEEK_SET);
    byte *buf = malloc(size);
    fread(buf, size, 1, fp);

    mem->rom = buf;
    mem->rom_size = size;
}